

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_mem_pool_test.c
# Opt level: O0

int main(void)

{
  long lVar1;
  void *pvVar2;
  uint local_cc;
  RK_U32 i;
  void *p [20];
  size_t size;
  MppMemPool pool;
  
  _mpp_log_l(4,"mpp_mem_pool_test","mpp_mem_pool_test start\n",0);
  lVar1 = mpp_mem_pool_init_f("main",0x400);
  if (lVar1 == 0) {
    _mpp_log_l(2,"mpp_mem_pool_test","mpp_mem_pool_test mpp_mem_pool_init failed\n",0);
LAB_001013da:
    _mpp_log_l(4,"mpp_mem_pool_test","mpp_mem_pool_test failed\n",0);
    pool._4_4_ = -1;
  }
  else {
    for (local_cc = 0; local_cc < 0x14; local_cc = local_cc + 1) {
      pvVar2 = (void *)mpp_mem_pool_get_f("main",lVar1);
      p[(ulong)local_cc - 1] = pvVar2;
      if (p[(ulong)local_cc - 1] == (void *)0x0) {
        _mpp_log_l(2,"mpp_mem_pool_test","mpp_mem_pool_test mpp_mem_pool_get failed\n",0);
        goto LAB_001013da;
      }
    }
    for (local_cc = 0; local_cc < 10; local_cc = local_cc + 1) {
      if (p[(ulong)local_cc - 1] != (void *)0x0) {
        mpp_mem_pool_put_f("main",lVar1,p[(ulong)local_cc - 1]);
        p[(ulong)local_cc - 1] = (void *)0x0;
      }
    }
    for (local_cc = 0; local_cc < 5; local_cc = local_cc + 1) {
      pvVar2 = (void *)mpp_mem_pool_get_f("main",lVar1);
      p[(ulong)local_cc - 1] = pvVar2;
      if (p[(ulong)local_cc - 1] == (void *)0x0) {
        _mpp_log_l(2,"mpp_mem_pool_test","mpp_mem_pool_test mpp_mem_pool_get failed\n",0);
        goto LAB_001013da;
      }
    }
    for (local_cc = 0; local_cc < 0x14; local_cc = local_cc + 1) {
      if (p[(ulong)local_cc - 1] != (void *)0x0) {
        mpp_mem_pool_put_f("main",lVar1,p[(ulong)local_cc - 1]);
        p[(ulong)local_cc - 1] = (void *)0x0;
      }
    }
    _mpp_log_l(4,"mpp_mem_pool_test","mpp_mem_pool_test success\n",0);
    pool._4_4_ = 0;
  }
  return pool._4_4_;
}

Assistant:

int main()
{
    MppMemPool pool = NULL;
    size_t size = MPP_MEM_POOL_TEST_SIZE;
    void *p [MPP_MEM_POOL_TEST_COUNT];
    RK_U32 i;

    mpp_log("mpp_mem_pool_test start\n");

    pool = mpp_mem_pool_init(size);
    if (NULL == pool) {
        mpp_err("mpp_mem_pool_test mpp_mem_pool_init failed\n");
        goto mpp_mem_pool_test_failed;
    }

    for (i = 0; i < MPP_MEM_POOL_TEST_COUNT; i++) {
        p[i] = mpp_mem_pool_get(pool);
        if (!p[i]) {
            mpp_err("mpp_mem_pool_test mpp_mem_pool_get failed\n");
            goto mpp_mem_pool_test_failed;
        }
    }

    for (i = 0; i < MPP_MEM_POOL_TEST_COUNT / 2; i++) {
        if (p[i]) {
            mpp_mem_pool_put(pool, p[i]);
            p[i] = NULL;
        }
    }

    for (i = 0; i < MPP_MEM_POOL_TEST_COUNT / 4; i++) {
        p[i] = mpp_mem_pool_get(pool);
        if (!p[i]) {
            mpp_err("mpp_mem_pool_test mpp_mem_pool_get failed\n");
            goto mpp_mem_pool_test_failed;
        }
    }

    for (i = 0; i < MPP_MEM_POOL_TEST_COUNT; i++) {
        if (p[i]) {
            mpp_mem_pool_put(pool, p[i]);
            p[i] = NULL;
        }
    }

    mpp_log("mpp_mem_pool_test success\n");
    return MPP_OK;

mpp_mem_pool_test_failed:
    mpp_log("mpp_mem_pool_test failed\n");
    return MPP_NOK;
}